

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskGen.cpp
# Opt level: O0

int NbIdenticalCar(char *track,char *searched_string,int size_max)

{
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  int local_2c;
  int iStack_28;
  bool correct;
  int j;
  int nb_car_found;
  int lg_max;
  int i;
  int size_max_local;
  char *searched_string_local;
  char *track_local;
  
  sVar3 = strlen(searched_string);
  iStack_28 = 0;
  for (local_2c = 0; local_2c < (int)sVar3; local_2c = local_2c + 1) {
    bVar2 = true;
    nb_car_found = 0;
    while( true ) {
      bVar1 = false;
      if (((nb_car_found < size_max) && (bVar1 = false, nb_car_found < 8)) &&
         (bVar1 = false, nb_car_found < (int)sVar3 - local_2c)) {
        bVar1 = bVar2;
      }
      if (!bVar1) break;
      if (((track[nb_car_found] == searched_string[local_2c + nb_car_found]) ||
          (track[nb_car_found] + 0x20 == (int)searched_string[local_2c + nb_car_found])) ||
         ((int)track[nb_car_found] == searched_string[local_2c + nb_car_found] + 0x20)) {
        if (iStack_28 <= nb_car_found) {
          iStack_28 = nb_car_found + 1;
        }
      }
      else {
        bVar2 = false;
      }
      nb_car_found = nb_car_found + 1;
    }
  }
  return iStack_28;
}

Assistant:

int NbIdenticalCar(const char* track, const char* searched_string, int size_max)
{
   int i = 0;
   int lg_max = strlen(searched_string);
   int nb_car_found = 0;

   for (int j = 0; j < lg_max; j++)
   {
      bool correct = true;
      for (i = 0; i < size_max && i < 8 && i < lg_max - j && correct; i++)
      {
         if (track[i] != searched_string[j + i]
            && track[i] + 0x20 != searched_string[j + i]
            && track[i] != searched_string[j + i] + 0x20)
         {
            correct = false;
         }
         else
         {
            if (i >= nb_car_found) nb_car_found = i + 1;
         }
      }
   }

   return nb_car_found;
}